

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

bool __thiscall Application::queryConfirm(Application *this,string *query)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_38 [8];
  string value;
  string *query_local;
  Application *this_local;
  
  value.field_2._8_8_ = query;
  std::__cxx11::string::string(local_38);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)value.field_2._8_8_);
  std::operator<<(poVar2,"?: ");
  std::operator>>((istream *)&std::cin,local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = toupper((int)*pcVar3);
  std::__cxx11::string::~string(local_38);
  return iVar1 == 0x59;
}

Assistant:

bool Application::queryConfirm(const std::string &query) {
  std::string value;
  std::cout << std::endl << query << "?: ";
  std::cin >> value;
  return toupper(*value.c_str()) == 'Y';
}